

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O1

string * __thiscall Record::Finds_abi_cxx11_(string *__return_storage_ptr__,Record *this,int c)

{
  pointer pKVar1;
  _Alloc_hider _Var2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pKVar6;
  bool bVar7;
  
  pKVar1 = (this->KS).super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->KS).super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pKVar1;
  bVar7 = lVar3 != 0;
  if (bVar7) {
    uVar5 = (lVar3 >> 3) * -0x3333333333333333;
    if (pKVar1->Column == c) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      pKVar6 = pKVar1;
      do {
        pKVar6 = pKVar6 + 1;
        if ((uVar5 + (uVar5 == 0)) - 1 == uVar4) goto LAB_0011e986;
        uVar4 = uVar4 + 1;
      } while (pKVar6->Column != c);
      bVar7 = uVar4 <= uVar5 && uVar5 - uVar4 != 0;
    }
    if (bVar7) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      _Var2._M_p = pKVar1[uVar4].Value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,_Var2._M_p,
                 _Var2._M_p + pKVar1[uVar4].Value._M_string_length);
      return __return_storage_ptr__;
    }
  }
LAB_0011e986:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cannot Find this Column!",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string Record::Finds(int c) {
	int i;
	for (i = 0; i < KS.size(); i++) {
		if (KS[i].Column == c)break;
	}
	if (i < KS.size())
		return KS[i].Value;
	else {
		cout << "Cannot Find this Column!" << endl;
		return "";
	}
}